

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O2

void __thiscall
boost::runtime::option::
option<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>
          (option *this,cstring *name,
          named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
          *m)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  iterator pvVar3;
  ref_type pbVar4;
  size_t sVar5;
  ref_type pbVar6;
  ref_type pbVar7;
  bool local_16a [2];
  string *local_168;
  param_cla_ids *local_160;
  string *local_158;
  named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
  *local_150;
  iterator local_148;
  iterator local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_cstring<const_char> local_118;
  value_type local_108;
  undefined8 local_107;
  undefined4 local_ff;
  undefined2 local_fb;
  char local_f9;
  cstring local_f8;
  named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  undefined1 local_c8;
  named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>
  local_c0;
  cstring local_b0;
  cstring local_a0;
  function1<void,_boost::unit_test::basic_cstring<const_char>_> local_90;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined8 local_5f;
  undefined4 local_57;
  undefined2 local_53;
  char local_51;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined8 local_3f;
  undefined4 local_37;
  undefined2 local_33;
  char local_31;
  
  pvVar3 = name->m_begin;
  local_140 = name->m_end;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_16a + 1);
  local_16a[1] = true;
  local_e0.m_value = m->m_value;
  local_e0.m_erased = m->m_erased;
  local_c0.m_value = local_16a;
  local_16a[0] = false;
  local_c8 = 0;
  local_c0.m_erased = false;
  (this->super_basic_param)._vptr_basic_param = (_func_int **)&PTR__basic_param_001e0df0;
  local_158 = &(this->super_basic_param).p_name;
  (this->super_basic_param).p_name._M_dataplus._M_p =
       (pointer)&(this->super_basic_param).p_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,pvVar3);
  paVar2 = &local_138.field_2;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  local_138._M_dataplus._M_p = (pointer)paVar2;
  pbVar4 = nfp::
           named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
           ::operator[](&local_e0);
  local_118.m_begin = pbVar4->m_begin;
  local_118.m_end = pbVar4->m_end;
  unit_test::assign_op<char,char_const>(&local_138,&local_118,0);
  local_168 = &(this->super_basic_param).p_description;
  paVar1 = &(this->super_basic_param).p_description.field_2;
  (this->super_basic_param).p_description._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p == paVar2) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,local_138.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(this->super_basic_param).p_description.field_2 + 8) =
         local_138.field_2._8_8_;
  }
  else {
    (local_168->_M_dataplus)._M_p = local_138._M_dataplus._M_p;
    paVar1->_M_allocated_capacity =
         CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,local_138.field_2._M_local_buf[0]);
  }
  (this->super_basic_param).p_description._M_string_length = local_138._M_string_length;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  local_150 = m;
  local_148 = pvVar3;
  local_138._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::~string((string *)&local_138);
  local_118.m_begin = &local_108;
  (this->super_basic_param).p_help._M_dataplus._M_p =
       (pointer)&(this->super_basic_param).p_help.field_2;
  (this->super_basic_param).p_help.field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(this->super_basic_param).p_help.field_2 + 1) = local_107;
  *(undefined4 *)((long)&(this->super_basic_param).p_help.field_2 + 9) = local_ff;
  *(undefined2 *)((long)&(this->super_basic_param).p_help.field_2 + 0xd) = local_fb;
  (this->super_basic_param).p_help.field_2._M_local_buf[0xf] = local_f9;
  (this->super_basic_param).p_help._M_string_length = 0;
  local_118.m_end = (iterator)0x0;
  local_108 = '\0';
  std::__cxx11::string::~string((string *)&local_118);
  local_50 = &local_40;
  (this->super_basic_param).p_env_var._M_dataplus._M_p =
       (pointer)&(this->super_basic_param).p_env_var.field_2;
  (this->super_basic_param).p_env_var.field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(this->super_basic_param).p_env_var.field_2 + 1) = local_3f;
  *(undefined4 *)((long)&(this->super_basic_param).p_env_var.field_2 + 9) = local_37;
  *(undefined2 *)((long)&(this->super_basic_param).p_env_var.field_2 + 0xd) = local_33;
  (this->super_basic_param).p_env_var.field_2._M_local_buf[0xf] = local_31;
  (this->super_basic_param).p_env_var._M_string_length = 0;
  local_48 = 0;
  local_40 = 0;
  std::__cxx11::string::~string((string *)&local_50);
  local_70 = &local_60;
  (this->super_basic_param).p_value_hint._M_dataplus._M_p =
       (pointer)&(this->super_basic_param).p_value_hint.field_2;
  (this->super_basic_param).p_value_hint.field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(this->super_basic_param).p_value_hint.field_2 + 1) = local_5f;
  *(undefined4 *)((long)&(this->super_basic_param).p_value_hint.field_2 + 9) = local_57;
  *(undefined2 *)((long)&(this->super_basic_param).p_value_hint.field_2 + 0xd) = local_53;
  (this->super_basic_param).p_value_hint.field_2._M_local_buf[0xf] = local_51;
  (this->super_basic_param).p_value_hint._M_string_length = 0;
  local_68 = 0;
  local_60 = 0;
  std::__cxx11::string::~string((string *)&local_70);
  (this->super_basic_param).p_optional = true;
  (this->super_basic_param).p_repeatable = false;
  (this->super_basic_param).p_has_optional_value = (class_property<bool>)0x1;
  (this->super_basic_param).p_has_default_value = (class_property<bool>)0x1;
  local_90.super_function_base.vtable = (vtable_base *)0x0;
  function1<void,_boost::unit_test::basic_cstring<const_char>_>::function1
            (&(this->super_basic_param).p_callback.
              super_function1<void,_boost::unit_test::basic_cstring<const_char>_>,&local_90);
  function1<void,_boost::unit_test::basic_cstring<const_char>_>::~function1(&local_90);
  local_160 = &(this->super_basic_param).m_cla_ids;
  (this->super_basic_param).m_cla_ids.
  super__Vector_base<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_basic_param).m_cla_ids.
  super__Vector_base<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_basic_param).m_cla_ids.
  super__Vector_base<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.m_begin = (iterator)help_prefix._0_8_;
  local_f8.m_end = (iterator)help_prefix._8_8_;
  local_a0.m_begin = local_148;
  local_a0.m_end = local_140;
  local_b0.m_begin = ":";
  sVar5 = unit_test::ut_detail::bcs_char_traits_impl<const_char>::length(":");
  local_b0.m_end = "MESSAGE:" + sVar5 + 7;
  basic_param::add_cla_id(&this->super_basic_param,&local_f8,&local_a0,&local_b0);
  (this->super_basic_param)._vptr_basic_param = (_func_int **)&PTR__basic_param_001e0d70;
  local_138._M_dataplus._M_p._0_1_ = 1;
  local_e0.m_value = local_150->m_value;
  local_e0.m_erased = local_150->m_erased;
  local_118.m_begin = (iterator)((ulong)local_118.m_begin & 0xffffffffffffff00);
  local_d0 = &local_138;
  local_c8 = 0;
  local_c0.m_value = (ref_type)&local_118;
  local_c0.m_erased = false;
  pbVar6 = nfp::
           named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>
           ::operator[]();
  (this->m_arg_factory).m_optional_value = *pbVar6;
  pbVar7 = nfp::
           named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>
           ::operator[](&local_c0);
  (this->m_arg_factory).m_default_value = *pbVar7;
  return;
}

Assistant:

option( cstring name, Modifiers const& m )
#endif
    : basic_param( name, true, false, nfp::opt_append( nfp::opt_append( m, optional_value = true), default_value = false) )
    , m_arg_factory( nfp::opt_append( nfp::opt_append( m, optional_value = true), default_value = false) )
    {
    }